

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<String,String>(char *fmtstr,String *args,String *args_1)

{
  String local_60;
  String local_40;
  String *local_20;
  String *args_local_1;
  String *args_local;
  char *fmtstr_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (String *)fmtstr;
  String::String(&local_60,fmtstr);
  format<String,String>(&local_40,&local_60,args_local_1,local_20);
  error(&local_40);
  String::~String(&local_40);
  String::~String(&local_60);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}